

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vma(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t cofs;
  GVecGen4_conflict12 *local_38;
  GVecGen4_conflict12 *fn;
  uint8_t es;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  uint uVar4;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar2 = get_field1(s,FLD_O_m5,FLD_C_d1);
  bVar1 = (byte)iVar2;
  if (bVar1 < 3) {
    uVar4 = (uint)(byte)(s->fields).field_0x9;
    uVar3 = uVar4 - 0xa9;
    if (5 < uVar3 && uVar4 != 0xaf) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate_vx.inc.c"
                 ,0x6dc,(char *)0x0);
    }
    switch((long)&switchD_0127181d::switchdataD_013c9be8 +
           (long)(int)(&switchD_0127181d::switchdataD_013c9be8)[uVar3]) {
    case 0x127181f:
      local_38 = op_vma::g_vmal + bVar1;
      break;
    case 0x127183c:
      local_38 = op_vma::g_vmah + bVar1;
      break;
    case 0x1271859:
      local_38 = op_vma::g_vmalh + bVar1;
      break;
    case 0x1271873:
      local_38 = op_vma::g_vmae + bVar1;
      break;
    case 0x127188d:
      local_38 = op_vma::g_vmale + bVar1;
      break;
    case 0x12718a7:
      local_38 = op_vma::g_vmao + bVar1;
      break;
    case 0x12718c1:
      local_38 = op_vma::g_vmalo + bVar1;
    }
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    dofs = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
    bofs = vec_full_reg_offset((uint8_t)iVar2);
    iVar2 = get_field1(s,FLD_O_v4,FLD_C_b4);
    cofs = vec_full_reg_offset((uint8_t)iVar2);
    tcg_gen_gvec_4_s390x(tcg_ctx_00,dofs,aofs,bofs,cofs,0x10,0x10,local_38);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vma(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m5);
    static const GVecGen4 g_vmal[3] = {
        { .fno = gen_helper_gvec_vmal8, },
        { .fno = gen_helper_gvec_vmal16, },
        { .fni4 = gen_mal_i32, },
    };
    static const GVecGen4 g_vmah[3] = {
        { .fno = gen_helper_gvec_vmah8, },
        { .fno = gen_helper_gvec_vmah16, },
        { .fni4 = gen_mah_i32, },
    };
    static const GVecGen4 g_vmalh[3] = {
        { .fno = gen_helper_gvec_vmalh8, },
        { .fno = gen_helper_gvec_vmalh16, },
        { .fni4 = gen_malh_i32, },
    };
    static const GVecGen4 g_vmae[3] = {
        { .fno = gen_helper_gvec_vmae8, },
        { .fno = gen_helper_gvec_vmae16, },
        { .fno = gen_helper_gvec_vmae32, },
    };
    static const GVecGen4 g_vmale[3] = {
        { .fno = gen_helper_gvec_vmale8, },
        { .fno = gen_helper_gvec_vmale16, },
        { .fno = gen_helper_gvec_vmale32, },
    };
    static const GVecGen4 g_vmao[3] = {
        { .fno = gen_helper_gvec_vmao8, },
        { .fno = gen_helper_gvec_vmao16, },
        { .fno = gen_helper_gvec_vmao32, },
    };
    static const GVecGen4 g_vmalo[3] = {
        { .fno = gen_helper_gvec_vmalo8, },
        { .fno = gen_helper_gvec_vmalo16, },
        { .fno = gen_helper_gvec_vmalo32, },
    };
    const GVecGen4 *fn;

    if (es > ES_32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    switch (s->fields.op2) {
    case 0xaa:
        fn = &g_vmal[es];
        break;
    case 0xab:
        fn = &g_vmah[es];
        break;
    case 0xa9:
        fn = &g_vmalh[es];
        break;
    case 0xae:
        fn = &g_vmae[es];
        break;
    case 0xac:
        fn = &g_vmale[es];
        break;
    case 0xaf:
        fn = &g_vmao[es];
        break;
    case 0xad:
        fn = &g_vmalo[es];
        break;
    default:
        g_assert_not_reached();
    }

    gen_gvec_4(tcg_ctx, get_field(s, v1), get_field(s, v2),
               get_field(s, v3), get_field(s, v4), fn);
    return DISAS_NEXT;
}